

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringview.h
# Opt level: O1

bool __thiscall QDBusUtil::isValidPartOfObjectPath(QDBusUtil *this,QStringView part)

{
  ushort uVar1;
  bool bVar2;
  QDBusUtil *pQVar3;
  
  if (this == (QDBusUtil *)0x0) {
    return false;
  }
  bVar2 = (long)this < 1;
  if (0 < (long)this) {
    pQVar3 = (QDBusUtil *)0x0;
    do {
      uVar1 = *(ushort *)(part.m_size + (long)pQVar3 * 2);
      if (uVar1 != 0x5f && ((0x19 < uVar1 - 0x61 && 9 < uVar1 - 0x30) && 0x19 < uVar1 - 0x41)) {
        return false;
      }
      pQVar3 = pQVar3 + 1;
    } while (this != pQVar3);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

[[nodiscard]] constexpr bool empty() const noexcept { return size() == 0; }